

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O2

int __thiscall QTextBrowserPrivate::init(QTextBrowserPrivate *this,EVP_PKEY_CTX *ctx)

{
  QWidget *this_00;
  bool bVar1;
  QTextDocument *signal;
  ConnectionType type;
  long in_FS_OFFSET;
  undefined1 local_30 [24];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)
             &(this->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.super_QFramePrivate.
              super_QWidgetPrivate.field_0x8;
  QWidgetTextControl::setTextInteractionFlags
            ((QWidgetTextControl *)(this->super_QTextEditPrivate).control,(TextInteractionFlags)0xd)
  ;
  QWidget::setCursor((this->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.viewport,
                     &this->oldCursor);
  bVar1 = QTextEdit::isReadOnly((QTextEdit *)this_00);
  QWidget::setAttribute(this_00,WA_InputMethodEnabled,!bVar1);
  QTextEdit::setUndoRedoEnabled((QTextEdit *)this_00,false);
  QWidget::setMouseTracking
            ((this->super_QTextEditPrivate).super_QAbstractScrollAreaPrivate.viewport,true);
  signal = QTextEdit::document((QTextEdit *)this_00);
  type = (ConnectionType)this;
  QObjectPrivate::connect<void(QTextDocument::*)(),void(QTextBrowserPrivate::*)()>
            ((Object *)local_30,(offset_in_QTextDocument_to_subr)signal,
             (Object *)QTextDocument::contentsChanged,0,type);
  QObjectPrivate::
  connect<void(QWidgetTextControl::*)(QString_const&),void(QTextBrowserPrivate::*)(QString_const&)>
            ((Object *)(local_30 + 8),
             (offset_in_QWidgetTextControl_to_subr)(this->super_QTextEditPrivate).control,
             (Object *)QWidgetTextControl::linkActivated,0,type);
  QObjectPrivate::
  connect<void(QWidgetTextControl::*)(QString_const&),void(QTextBrowserPrivate::*)(QString_const&)>
            ((Object *)(local_30 + 0x10),
             (offset_in_QWidgetTextControl_to_subr)(this->super_QTextEditPrivate).control,
             (Object *)QWidgetTextControl::linkHovered,0,type);
  std::array<QMetaObject::Connection,_3UL>::operator=
            (&this->connections,(array<QMetaObject::Connection,_3UL> *)local_30);
  std::array<QMetaObject::Connection,_3UL>::~array((array<QMetaObject::Connection,_3UL> *)local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QTextBrowserPrivate::init()
{
    Q_Q(QTextBrowser);
    control->setTextInteractionFlags(Qt::TextBrowserInteraction);
#ifndef QT_NO_CURSOR
    viewport->setCursor(oldCursor);
#endif
    q->setAttribute(Qt::WA_InputMethodEnabled, shouldEnableInputMethod(q));
    q->setUndoRedoEnabled(false);
    viewport->setMouseTracking(true);
    connections = {
        QObjectPrivate::connect(q->document(), &QTextDocument::contentsChanged,
                                this, &QTextBrowserPrivate::documentModified),
        QObjectPrivate::connect(control, &QWidgetTextControl::linkActivated,
                                this, &QTextBrowserPrivate::activateAnchor),
        QObjectPrivate::connect(control, &QWidgetTextControl::linkHovered,
                                this, &QTextBrowserPrivate::highlightLink),
    };
}